

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_NodeIntersectLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  void **ppvVar4;
  void **ppvVar5;
  int nCapMin;
  void **ppvVar6;
  void **ppvVar7;
  
  ppvVar6 = vArr1->pArray;
  ppvVar7 = vArr2->pArray;
  iVar3 = vArr1->nSize;
  ppvVar1 = ppvVar6 + iVar3;
  nCapMin = vArr2->nSize;
  ppvVar5 = ppvVar7 + nCapMin;
  if (nCapMin < iVar3) {
    nCapMin = iVar3;
  }
  Vec_PtrGrow(vArr,nCapMin);
  ppvVar4 = vArr->pArray;
LAB_00586191:
  do {
    if ((ppvVar1 <= ppvVar6) || (ppvVar5 <= ppvVar7)) {
      iVar3 = (int)((ulong)((long)ppvVar4 - (long)vArr->pArray) >> 3);
      vArr->nSize = iVar3;
      if (vArr->nCap < iVar3) {
        __assert_fail("vArr->nSize <= vArr->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                      ,0x511,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      if (iVar3 <= vArr1->nSize) {
        if (iVar3 <= vArr2->nSize) {
          return;
        }
        __assert_fail("vArr->nSize <= vArr2->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                      ,0x513,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      __assert_fail("vArr->nSize <= vArr1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                    ,0x512,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pvVar2 = *ppvVar6;
    iVar3 = *(int *)((long)pvVar2 + 0x24);
    if (iVar3 == *(int *)((long)*ppvVar7 + 0x24)) {
      ppvVar6 = ppvVar6 + 1;
      *ppvVar4 = pvVar2;
      ppvVar4 = ppvVar4 + 1;
    }
    else if (iVar3 < *(int *)((long)*ppvVar7 + 0x24)) {
      ppvVar6 = ppvVar6 + 1;
      goto LAB_00586191;
    }
    ppvVar7 = ppvVar7 + 1;
  } while( true );
}

Assistant:

void Aig_NodeIntersectLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Abc_MaxInt( Vec_PtrSize(vArr1), Vec_PtrSize(vArr2) ) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
//            *pBeg++ = *pBeg1++;
            pBeg1++;
        else 
//            *pBeg++ = *pBeg2++;
            pBeg2++;
    }
//    while ( pBeg1 < pEnd1 )
//        *pBeg++ = *pBeg1++;
//    while ( pBeg2 < pEnd2 )
//        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize <= vArr1->nSize );
    assert( vArr->nSize <= vArr2->nSize );
}